

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.h
# Opt level: O2

Vec_Int_t * Ga2_ObjLeaves(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  
  pVVar1 = p->vMapping;
  iVar2 = Ga2_ObjOffset(p,pObj);
  Ga2_ObjLeaves::v.nSize = Vec_IntEntry(pVVar1,iVar2);
  pVVar1 = p->vMapping;
  iVar2 = Ga2_ObjOffset(p,pObj);
  if ((-2 < iVar2) && ((int)(iVar2 + 1U) < pVVar1->nSize)) {
    Ga2_ObjLeaves::v.pArray = pVVar1->pArray + (iVar2 + 1U);
    return (Vec_Int_t *)Ga2_ObjLeaves::v.pArray;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline Vec_Int_t * Ga2_ObjLeaves( Gia_Man_t * p, Gia_Obj_t * pObj )          { static Vec_Int_t v; v.nSize = Ga2_ObjLeaveNum(p, pObj), v.pArray = Ga2_ObjLeavePtr(p, pObj); return &v;       }